

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingQtWriter.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  QArrayData *pQVar1;
  QTextStream *this;
  size_t sVar2;
  storage_type *psVar3;
  int iVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QStringView text;
  QString filename;
  QImage result;
  QString local_70;
  QTextStream *local_58;
  QString local_50;
  char *local_38;
  
  if (argc == 4) {
    sVar2 = strlen(argv[1]);
    ZXing::BarcodeFormatFromString(sVar2);
    if (argv[2] == (char *)0x0) {
      psVar3 = (storage_type *)0x0;
    }
    else {
      psVar3 = (storage_type *)strlen(argv[2]);
    }
    QVar6.m_data = psVar3;
    QVar6.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar6);
    pQVar1 = (QArrayData *)CONCAT44(local_50.d.d._4_4_,local_50.d.d._0_4_);
    text.m_data._4_4_ = local_50.d.size._4_4_;
    text.m_data._0_4_ = (undefined4)local_50.d.size;
    if (argv[3] == (char *)0x0) {
      psVar3 = (storage_type *)0x0;
    }
    else {
      psVar3 = (storage_type *)strlen(argv[3]);
    }
    QVar7.m_data = psVar3;
    QVar7.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar7);
    local_70.d.d = (Data *)CONCAT44(local_50.d.d._4_4_,local_50.d.d._0_4_);
    text.m_size = (qsizetype)&local_50;
    ZXingQt::WriteBarcode(text,(BarcodeFormat)local_50.d.ptr);
    QImage::save(&local_50,(char *)&local_70,0);
    QImage::~QImage((QImage *)&local_50);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,8);
      }
    }
    iVar4 = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      iVar4 = 0;
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
  }
  else {
    local_50.d.d._0_4_ = 2;
    local_50.d.d._4_4_ = 0;
    local_50.d.ptr._0_4_ = 0;
    local_50.d.ptr._4_4_ = 0;
    local_50.d.size._0_4_ = 0;
    local_50.d.size._4_4_ = 0;
    local_38 = "default";
    QMessageLogger::debug();
    this = local_58;
    QVar5.m_data = (storage_type *)0x2f;
    QVar5.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(this,&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_58[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_58,' ');
    }
    QDebug::~QDebug((QDebug *)&local_58);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
	if (argc != 4) {
		qDebug() << "usage: ZXingQtWriter <format> <text> <filename>";
		return 1;
	}

	auto format = ZXing::BarcodeFormatFromString(argv[1]);
	auto text = QString(argv[2]);
	auto filename = QString(argv[3]);

	auto result = ZXingQt::WriteBarcode(text, format);

	result.save(filename);

	return 0;
}